

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void duckdb_je_sdallocx_default(void *ptr,size_t size,int flags)

{
  uint8_t uVar1;
  uint64_t uVar2;
  long lVar3;
  tcaches_t *ptVar4;
  uint uVar5;
  szind_t binind;
  tsd_t *tsd;
  ulong uVar6;
  void **ppvVar7;
  tcaches_t tVar8;
  size_t __n;
  ulong uVar9;
  ulong uVar10;
  uintptr_t in_R8;
  cache_bin_t *bin;
  cache_bin_t *cache_bin;
  rtree_t *rtree;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  uintptr_t args_raw [3];
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1e0;
  void *local_1c8;
  size_t local_1c0;
  long local_1b8;
  _Bool local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_024d8b58);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
  }
  ptVar4 = duckdb_je_tcaches;
  uVar6 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  if (uVar6 == 0) {
    if (size < 0x1001) {
      __n = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_01c5c03c;
      uVar6 = size * 2 - 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar6 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
      __n = ~uVar6 + size & uVar6;
    }
  }
  else {
    if (uVar6 < 0x1001 && size < 0x3801) {
      uVar10 = -uVar6 & (size + uVar6) - 1;
      if (uVar10 < 0x1001) {
        __n = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar10 + 7 >> 3]];
      }
      else if (uVar10 < 0x7000000000000001) {
        uVar9 = uVar10 * 2 - 1;
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar9 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
        __n = ~uVar9 + uVar10 & uVar9;
      }
      else {
        __n = 0;
      }
      if (__n < 0x4000) goto LAB_01c5c0a1;
    }
    if (uVar6 < 0x7000000000000001) {
      uVar10 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar10 = size * 2 - 1;
          lVar3 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar10 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
          uVar10 = ~uVar10 + size & uVar10;
        }
        else {
          uVar10 = 0;
        }
        if (uVar10 < size) goto LAB_01c5c03c;
      }
      __n = 0;
      if (uVar10 <= (duckdb_je_sz_large_pad + (uVar6 + 0xfff & 0x7ffffffffffff000) + uVar10) -
                    0x1000) {
        __n = uVar10;
      }
    }
    else {
LAB_01c5c03c:
      __n = 0;
    }
  }
LAB_01c5c0a1:
  uVar6 = 0xfffffffe;
  uVar5 = flags & 0xfff00;
  if (uVar5 != 0) {
    if (uVar5 == 0x100) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = (ulong)((uVar5 >> 8) - 2);
    }
  }
  uVar1 = (tsd->state).repr;
  if ((int)uVar6 == -1) {
LAB_01c5c1af:
    tcache.tcache = (tcache_t *)0x0;
  }
  else if ((int)uVar6 == -2) {
    if (uVar1 == '\0') {
      tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
    else {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level != '\0')
      goto LAB_01c5c1af;
      tcache.tcache = (tcache_t *)0x0;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
        tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      }
    }
  }
  else {
    if (duckdb_je_tcaches[uVar6].field_0.tcache == (tcache_t *)0x0) {
      duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
      abort();
    }
    if (duckdb_je_tcaches[uVar6].field_0.tcache == (tcache_t *)&DAT_00000001) {
      tVar8.field_0 = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcache_create_explicit(tsd)
      ;
      ptVar4[uVar6].field_0 = tVar8.field_0;
    }
    tcache.tcache = ptVar4[uVar6].field_0.tcache;
  }
  if (uVar1 == '\0') {
    if (tcache.tcache == (tcache_t *)0x0) {
LAB_01c5c332:
      arena_sdalloc_no_tcache((tsdn_t *)tsd,ptr,__n);
      goto LAB_01c5c21a;
    }
    if (__n < 0x1001) {
      binind = (szind_t)duckdb_je_sz_size2index_tab[__n + 7 >> 3];
    }
    else {
      binind = sz_size2index_compute(__n);
    }
    if (binind < 0x24) {
      cache_bin = (tcache.tcache)->bins + binind;
      ppvVar7 = cache_bin->stack_head;
      if (cache_bin->low_bits_full == (uint16_t)ppvVar7) goto LAB_01c5c3c7;
LAB_01c5c20e:
      cache_bin->stack_head = ppvVar7 + -1;
      ppvVar7[-1] = ptr;
      goto LAB_01c5c21a;
    }
    if (binind < (tcache.tcache)->tcache_slow->tcache_nbins) {
      ppvVar7 = (tcache.tcache)->bins[binind].stack_head;
      if (ppvVar7 != (void **)&duckdb_je_disabled_bin) {
        cache_bin = (tcache.tcache)->bins + binind;
        if (cache_bin->low_bits_full != (uint16_t)ppvVar7) goto LAB_01c5c20e;
        duckdb_je_tcache_bin_flush_large
                  (tsd,tcache.tcache,cache_bin,binind,
                   (uint)((cache_bin->bin_info).ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        ppvVar7 = cache_bin->stack_head;
        if (cache_bin->low_bits_full == (uint16_t)ppvVar7) goto LAB_01c5c21a;
        goto LAB_01c5c40d;
      }
    }
  }
  else {
    local_1b8 = (long)flags;
    local_1c8 = ptr;
    local_1c0 = size;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_sdallocx,ptr,(uintptr_t *)&local_1c8);
    if (duckdb_je_opt_junk_free == true) {
      switchD_0105b559::default(ptr,0x5a,__n);
    }
    if (tcache.tcache == (tcache_t *)0x0) goto LAB_01c5c332;
    if (__n < 0x1001) {
      binind = (szind_t)duckdb_je_sz_size2index_tab[__n + 7 >> 3];
    }
    else {
      binind = sz_size2index_compute(__n);
    }
    if (binind < 0x24) {
      cache_bin = (tcache.tcache)->bins + binind;
      ppvVar7 = cache_bin->stack_head;
      if (cache_bin->low_bits_full != (uint16_t)ppvVar7) goto LAB_01c5c20e;
LAB_01c5c3c7:
      if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        goto LAB_01c5c21a;
      }
      duckdb_je_tcache_bin_flush_small
                (tsd,tcache.tcache,cache_bin,binind,
                 (uint)((cache_bin->bin_info).ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c5c3fa:
      ppvVar7 = cache_bin->stack_head;
      if (cache_bin->low_bits_full == (uint16_t)ppvVar7) goto LAB_01c5c21a;
LAB_01c5c40d:
      cache_bin->stack_head = ppvVar7 + -1;
      ppvVar7[-1] = ptr;
      goto LAB_01c5c21a;
    }
    if (binind < (tcache.tcache)->tcache_slow->tcache_nbins) {
      ppvVar7 = (tcache.tcache)->bins[binind].stack_head;
      if (ppvVar7 != (void **)&duckdb_je_disabled_bin) {
        cache_bin = (tcache.tcache)->bins + binind;
        if (cache_bin->low_bits_full != (uint16_t)ppvVar7) {
          cache_bin->stack_head = ppvVar7 + -1;
          ppvVar7[-1] = ptr;
          goto LAB_01c5c21a;
        }
        duckdb_je_tcache_bin_flush_large
                  (tsd,tcache.tcache,cache_bin,binind,
                   (uint)((cache_bin->bin_info).ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_01c5c3fa;
      }
    }
  }
  if (tsd == (tsd_t *)0x0) {
    rtree = (rtree_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1e0,(tsdn_t *)tsd,rtree,(rtree_ctx_t *)ptr,in_R8);
  duckdb_je_large_dalloc((tsdn_t *)tsd,local_1e0.edata);
LAB_01c5c21a:
  local_1b0 = false;
  local_1a8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_1a0 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_198 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_190 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
  ;
  uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar2 + __n;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      uVar2 <= __n) {
    duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&stack0xfffffffffffffe50);
  }
  return;
}

Assistant:

JEMALLOC_NOINLINE void
sdallocx_default(void *ptr, size_t size, int flags) {
	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	size_t usize = inallocx(tsd_tsdn(tsd), size, flags);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		isfree(tsd, ptr, usize, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, size, flags};
		hook_invoke_dalloc(hook_dalloc_sdallocx, ptr, args_raw);
		isfree(tsd, ptr, usize, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));
}